

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void benchmark_wmutex_uncontended(testing t)

{
  nsync_pthread_rwlock_s *pnVar1;
  nsync_pthread_rwlock_s *local_20;
  nsync_pthread_rwlock_ mu;
  int n;
  int i;
  testing t_local;
  
  _n = t;
  mu._0_4_ = testing_n(t);
  pnVar1 = (nsync_pthread_rwlock_s *)operator_new(0x60);
  nsync_pthread_rwlock_s::nsync_pthread_rwlock_s(pnVar1);
  local_20 = pnVar1;
  for (mu._4_4_ = 0; pnVar1 = local_20, mu._4_4_ != (int)mu; mu._4_4_ = mu._4_4_ + 1) {
    nsync_pthread_rwlock_wrlock_(&local_20);
    nsync_pthread_rwlock_unlock_(&local_20);
  }
  if (local_20 != (nsync_pthread_rwlock_s *)0x0) {
    nsync_pthread_rwlock_s::~nsync_pthread_rwlock_s(local_20);
    operator_delete(pnVar1);
  }
  return;
}

Assistant:

static void benchmark_wmutex_uncontended (testing t) {
	int i;
	int n = testing_n (t);
	pthread_rwlock_t mu;
	pthread_rwlock_init (&mu, NULL);
	for (i = 0; i != n; i++) {
		pthread_rwlock_wrlock (&mu);
		pthread_rwlock_unlock (&mu);
	}
	pthread_rwlock_destroy (&mu);
}